

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatformTest.cpp
# Opt level: O3

void __thiscall
TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_AccessViolationInSeparateProcessWorks_Test
::testBody(TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_AccessViolationInSeparateProcessWorks_Test
           *this)

{
  TestTestingFixture *this_00;
  SimpleString local_20;
  
  this_00 = &(this->
             super_TEST_GROUP_CppUTestGroupUTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess
             ).fixture;
  TestTestingFixture::setRunTestsInSeperateProcess(this_00);
  TestTestingFixture::setTestFunction(this_00,accessViolationTestFunction_);
  TestTestingFixture::runAllTests(this_00);
  SimpleString::SimpleString(&local_20,"Failed in separate process - killed by signal 11");
  TestTestingFixture::assertPrintContains(this_00,&local_20);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_20,"Errors (1 failures, 1 tests, 1 ran");
  TestTestingFixture::assertPrintContains(this_00,&local_20);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

TEST(UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess, AccessViolationInSeparateProcessWorks)
{
    fixture.setRunTestsInSeperateProcess();
    fixture.setTestFunction((void(*)())accessViolationTestFunction_);
    fixture.runAllTests();
    fixture.assertPrintContains("Failed in separate process - killed by signal 11");
    fixture.assertPrintContains("Errors (1 failures, 1 tests, 1 ran");
}